

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O1

Value * __thiscall
duckdb::KeyValueSecretReader::GetSecretKey
          (Value *__return_storage_ptr__,KeyValueSecretReader *this,string *secret_key)

{
  SettingLookupResult SVar1;
  LogicalType LStack_38;
  
  LogicalType::LogicalType(&LStack_38,SQLNULL);
  Value::Value(__return_storage_ptr__,&LStack_38);
  LogicalType::~LogicalType(&LStack_38);
  SVar1 = TryGetSecretKey(this,secret_key,__return_storage_ptr__);
  if (SVar1.scope != INVALID) {
    return __return_storage_ptr__;
  }
  ThrowNotFoundError(this,secret_key);
}

Assistant:

Value KeyValueSecretReader::GetSecretKey(const string &secret_key) {
	Value result;
	if (TryGetSecretKey(secret_key, result)) {
		return result;
	}
	ThrowNotFoundError(secret_key);
}